

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall
Lowerer::GenerateRecyclerAllocAligned
          (Lowerer *this,JnHelperMethod allocHelper,size_t allocSize,RegOpnd *newObjDst,
          Instr *insertionPointInstr,bool inOpHelper)

{
  LowererMD *this_00;
  bool bVar1;
  uint sourceContextId;
  uint functionId;
  int iVar2;
  JITTimeFunctionBody *this_01;
  FunctionJITTimeInfo *this_02;
  LabelInstr *allocHelperLabel;
  LabelInstr *allocDoneLabel;
  undefined4 extraout_var;
  AddrOpnd *opndArg;
  IntConstOpnd *opndArg_00;
  HelperCallOpnd *src1Opnd;
  Instr *instr;
  
  this_01 = JITTimeWorkItem::GetJITFunctionBody(insertionPointInstr->m_func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_01);
  this_02 = JITTimeWorkItem::GetJITTimeInfo(insertionPointInstr->m_func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_02);
  bVar1 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015a4e90,JitAllocNewObjPhase,sourceContextId,functionId);
  allocDoneLabel = (LabelInstr *)0x0;
  if ((allocSize < 0x301) && (!bVar1)) {
    allocHelperLabel = IR::LabelInstr::New(Label,this->m_func,true);
    allocDoneLabel = IR::LabelInstr::New(Label,this->m_func,inOpHelper);
    LowererMD::GenerateFastRecyclerAlloc
              (&this->m_lowererMD,allocSize,newObjDst,insertionPointInstr,allocHelperLabel,
               allocDoneLabel);
    IR::Instr::InsertBefore(insertionPointInstr,&allocHelperLabel->super_Instr);
  }
  this_00 = &this->m_lowererMD;
  iVar2 = (*insertionPointInstr->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[0x1c])();
  opndArg = IR::AddrOpnd::New(CONCAT44(extraout_var,iVar2),AddrOpndKindDynamicMisc,
                              insertionPointInstr->m_func,false,(Var)0x0);
  LowererMD::LoadHelperArgument(this_00,insertionPointInstr,&opndArg->super_Opnd);
  opndArg_00 = IR::IntConstOpnd::New((long)(int)allocSize,TyUint32,this->m_func,true);
  LowererMD::LoadHelperArgument(this_00,insertionPointInstr,&opndArg_00->super_Opnd);
  src1Opnd = IR::HelperCallOpnd::New(allocHelper,this->m_func);
  instr = IR::Instr::New(Call,&newObjDst->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(insertionPointInstr,instr);
  LowererMD::LowerCall(this_00,instr,0);
  if (allocDoneLabel != (LabelInstr *)0x0) {
    IR::Instr::InsertBefore(insertionPointInstr,&allocDoneLabel->super_Instr);
    return;
  }
  return;
}

Assistant:

void
Lowerer::GenerateRecyclerAllocAligned(IR::JnHelperMethod allocHelper, size_t allocSize, IR::RegOpnd* newObjDst, IR::Instr* insertionPointInstr, bool inOpHelper)
{
    IR::LabelInstr * allocDoneLabel = nullptr;

    if (!PHASE_OFF(Js::JitAllocNewObjPhase, insertionPointInstr->m_func) && HeapInfo::IsSmallObject(allocSize))
    {
        IR::LabelInstr * allocHelperLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
        allocDoneLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, inOpHelper);

        this->m_lowererMD.GenerateFastRecyclerAlloc(allocSize, newObjDst, insertionPointInstr, allocHelperLabel, allocDoneLabel);

        // $allocHelper:
        insertionPointInstr->InsertBefore(allocHelperLabel);
    }

    // call JavascriptOperators::AllocMemForScObject(allocSize, scriptContext->GetRecycler())
    this->m_lowererMD.LoadHelperArgument(insertionPointInstr, this->LoadScriptContextValueOpnd(insertionPointInstr, ScriptContextValue::ScriptContextRecycler));
    this->m_lowererMD.LoadHelperArgument(insertionPointInstr, IR::IntConstOpnd::New((int32)allocSize, TyUint32, m_func, true));
    IR::Instr *newObjCall = IR::Instr::New(Js::OpCode::Call, newObjDst,  IR::HelperCallOpnd::New(allocHelper, m_func), m_func);
    insertionPointInstr->InsertBefore(newObjCall);
    this->m_lowererMD.LowerCall(newObjCall, 0);

    if (allocDoneLabel != nullptr)
    {
        // $allocDone:
        insertionPointInstr->InsertBefore(allocDoneLabel);
    }
}